

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

Expr eq(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
       int argc)

{
  _Bool _Var1;
  Expr EVar2;
  Expr EVar3;
  Expr EVar4;
  Expr b_00;
  Expr a_00;
  Expr b;
  Expr a;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  anon_union_8_8_707b72ea_for_Expr_1 local_10;
  
  if (argc < 2) {
    printf("eq: too few arguments\n");
    exit(1);
  }
  if (2 < argc) {
    printf("eq: too many arguments\n");
    exit(1);
  }
  EVar2._4_4_ = 0;
  EVar2.type = args->type;
  EVar2.field_1.val_atom = (args->field_1).val_atom;
  EVar2 = exec_eval(exec,callContext,EVar2);
  EVar3._4_4_ = 0;
  EVar3.type = args[1].type;
  EVar3.field_1.val_atom = args[1].field_1.val_atom;
  EVar3 = exec_eval(exec,callContext,EVar3);
  a_00._4_4_ = 0;
  a_00.type = EVar2.type;
  b_00._4_4_ = 0;
  b_00.type = EVar3.type;
  b_00.field_1.val_atom = EVar3.field_1.val_atom;
  a_00.field_1.val_atom = EVar2.field_1.val_atom;
  _Var1 = is_equal(a_00,b_00);
  if (_Var1) {
    exec_local = *(pExecutor *)&exec->t;
    local_10 = (anon_union_8_8_707b72ea_for_Expr_1)(exec->t).field_1.val_atom;
  }
  else {
    exec_local = *(pExecutor *)&exec->nil;
    local_10 = (anon_union_8_8_707b72ea_for_Expr_1)(exec->nil).field_1.val_atom;
  }
  EVar4._0_8_ = (ulong)exec_local & 0xffffffff;
  EVar4.field_1.val_atom = local_10.val_atom;
  return EVar4;
}

Assistant:

BUILTIN_FUNC(eq)
{
    if (argc < 2)
    {
        log("eq: too few arguments");
        exit(1);
    }
    if (argc > 2)
    {
        log("eq: too many arguments");
        exit(1);
    }
    Expr a = exec_eval(exec, callContext, args[0]);
    Expr b = exec_eval(exec, callContext, args[1]);
    if (is_equal(a, b))
        return exec->t;
    else
        return exec->nil;
}